

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateStripFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,string *depName,
          Indent indent)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  ostream *poVar5;
  Indent IVar6;
  int iVar7;
  string strip;
  string local_b8;
  long *local_98;
  long local_90;
  long local_88 [2];
  string *local_78;
  string local_70;
  string local_50;
  
  pcVar1 = this->LocalGenerator->Makefile;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_78 = config;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_STRIP","");
  psVar4 = cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
  local_98 = local_88;
  pcVar2 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + psVar4->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != 0) {
    IVar6.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar6.Level = IVar6.Level + -1;
      } while (IVar6.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"if(CMAKE_INSTALL_DO_STRIP)\n",0x1b);
    if (-2 < indent.Level) {
      iVar7 = indent.Level + 2;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_98,local_90);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ",2);
    pcVar1 = this->LocalGenerator->Makefile;
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"APPLE","");
    bVar3 = cmMakefile::IsOn(pcVar1,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"-x ",3);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
    GetDestination(&local_70,this,local_78);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_50,&local_70);
    cmInstallGenerator::GetDestDirPath(&local_b8,&local_50);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"/",1);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(depName->_M_dataplus)._M_p,depName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\")\n",3);
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"endif()\n",8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_98 != local_88) {
    operator_delete(local_98,local_88[0] + 1);
  }
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateStripFixup(
  std::ostream& os, const std::string& config, const std::string& depName,
  Indent indent)
{
  std::string strip =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition("CMAKE_STRIP");
  if (!strip.empty()) {
    os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n"
       << indent.Next() << "execute_process(COMMAND \"" << strip << "\" ";
    if (this->LocalGenerator->GetMakefile()->IsOn("APPLE")) {
      os << "-x ";
    }
    os << "\""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n"
       << indent << "endif()\n";
  }
}